

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtreeview.cpp
# Opt level: O1

void QTreeView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  int *piVar2;
  QAbstractItemViewPrivate *this;
  byte bVar3;
  undefined4 uVar4;
  long lVar5;
  int iVar6;
  QModelIndex *index;
  QWidget *this_00;
  long in_FS_OFFSET;
  void *local_48;
  void *pvStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    pvStack_40 = _a[1];
    iVar6 = 0;
    goto LAB_005b5853;
  case 1:
    pvStack_40 = _a[1];
    iVar6 = 1;
LAB_005b5853:
    local_48 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_48);
    break;
  case 2:
    hideColumn((QTreeView *)_o,*_a[1]);
    break;
  case 3:
    showColumn((QTreeView *)_o,*_a[1]);
    break;
  case 4:
    expand((QTreeView *)_o,(QModelIndex *)_a[1]);
    break;
  case 5:
    collapse((QTreeView *)_o,(QModelIndex *)_a[1]);
    break;
  case 6:
    resizeColumnToContents((QTreeView *)_o,*_a[1]);
    break;
  case 7:
    sortByColumn((QTreeView *)_o,*_a[1],*_a[2]);
    break;
  case 8:
    expandAll((QTreeView *)_o);
    break;
  case 9:
    index = (QModelIndex *)_a[1];
    iVar6 = *_a[2];
    goto LAB_005b590c;
  case 10:
    index = (QModelIndex *)_a[1];
    iVar6 = -1;
LAB_005b590c:
    expandRecursively((QTreeView *)_o,index,iVar6);
    break;
  case 0xb:
    collapseAll((QTreeView *)_o);
    break;
  case 0xc:
    expandToDepth((QTreeView *)_o,*_a[1]);
    break;
  case 0xd:
    columnResized((QTreeView *)_o,*_a[1],_id,0x6fea28);
    break;
  case 0xe:
    columnCountChanged((QTreeView *)_o,*_a[1],*_a[2]);
    break;
  case 0xf:
    lVar5 = *(long *)(_o + 8);
    (**(code **)(*(long *)_o + 0x260))(_o);
    QWidget::update(*(QWidget **)(lVar5 + 0x2b0));
    break;
  case 0x11:
    rowsRemoved((QTreeView *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
    break;
  case 0x12:
    (**(code **)(*(long *)_o + 0x280))(_o);
  }
  if (_c != ReadProperty) {
    if (_c == WriteProperty) goto switchD_005b5797_caseD_2;
    if (_c == IndexOfMethod) {
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == expanded) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto LAB_005b5ba6;
      }
      if (((code *)*plVar1 == collapsed) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto LAB_005b5ba6;
      }
      if (_c == WriteProperty) goto switchD_005b5797_caseD_2;
      if (_c == ReadProperty) goto switchD_005b5797_caseD_1;
    }
    goto switchD_005b5797_caseD_3;
  }
switchD_005b5797_caseD_1:
  if (10 < (uint)_id) goto LAB_005b5a6d;
  switch(_id) {
  case 0:
    uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x618);
    goto LAB_005b5a39;
  case 1:
    uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x598);
LAB_005b5a39:
    *(undefined4 *)*_a = uVar4;
    goto LAB_005b5a6d;
  case 2:
    bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c1);
    break;
  case 3:
    bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c0);
    break;
  case 4:
    bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c2);
    break;
  case 5:
    bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c3);
    break;
  case 6:
    bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5e0);
    break;
  case 7:
    bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c5);
    break;
  case 8:
    bVar3 = *(byte *)(*(long *)(_o + 8) + 0x491);
    break;
  case 9:
    bVar3 = *(byte *)(*(long *)(*(long *)(*(long *)(_o + 8) + 0x590) + 0x20) + 10) & 1;
    break;
  case 10:
    bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c4);
  }
  *(byte *)*_a = bVar3;
LAB_005b5a6d:
  if (_c == WriteProperty) {
switchD_005b5797_caseD_2:
    if ((uint)_id < 0xb) {
      piVar2 = (int *)*_a;
      switch(_id) {
      case 0:
        *(int *)(*(long *)(_o + 8) + 0x618) = *piVar2;
        break;
      case 1:
        lVar5 = *(long *)(_o + 8);
        if ((*(char *)(lVar5 + 0x5c6) != '\x01') || (*(int *)(lVar5 + 0x598) != *piVar2)) {
          *(int *)(lVar5 + 0x598) = *piVar2;
          *(undefined1 *)(lVar5 + 0x5c6) = 1;
          this_00 = *(QWidget **)(lVar5 + 0x2b0);
LAB_005b5b47:
          QWidget::update(this_00);
        }
        break;
      case 2:
        lVar5 = *(long *)(_o + 8);
        if (*(char *)(lVar5 + 0x5c1) != (char)*piVar2) {
          *(char *)(lVar5 + 0x5c1) = (char)*piVar2;
LAB_005b5b13:
          this_00 = *(QWidget **)(lVar5 + 0x2b0);
          goto LAB_005b5b47;
        }
        break;
      case 3:
        *(char *)(*(long *)(_o + 8) + 0x5c0) = (char)*piVar2;
        break;
      case 4:
        *(char *)(*(long *)(_o + 8) + 0x5c2) = (char)*piVar2;
        break;
      case 5:
        setSortingEnabled((QTreeView *)_o,SUB41(*piVar2,0));
        break;
      case 6:
        *(char *)(*(long *)(_o + 8) + 0x5e0) = (char)*piVar2;
        break;
      case 7:
        lVar5 = *(long *)(_o + 8);
        if (*(char *)(lVar5 + 0x5c5) != (char)*piVar2) {
          *(char *)(lVar5 + 0x5c5) = (char)*piVar2;
          goto LAB_005b5b13;
        }
        break;
      case 8:
        this = *(QAbstractItemViewPrivate **)(_o + 8);
        if (this->wrapItemText != SUB41(*piVar2,0)) {
          this->wrapItemText = SUB41(*piVar2,0);
          QAbstractItemViewPrivate::doDelayedItemsLayout(this,0);
        }
        break;
      case 9:
        QWidget::setHidden(*(QWidget **)(*(long *)(_o + 8) + 0x590),SUB41(*piVar2,0));
        break;
      case 10:
        *(char *)(*(long *)(_o + 8) + 0x5c4) = (char)*piVar2;
      }
    }
  }
switchD_005b5797_caseD_3:
  if (_id == 1 && _c == ResetProperty) {
    resetIndentation((QTreeView *)_o);
  }
LAB_005b5ba6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTreeView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->expanded((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->collapsed((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->hideColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->showColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->expand((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 5: _t->collapse((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 6: _t->resizeColumnToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->sortByColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 8: _t->expandAll(); break;
        case 9: _t->expandRecursively((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->expandRecursively((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 11: _t->collapseAll(); break;
        case 12: _t->expandToDepth((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 13: _t->columnResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->columnCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 15: _t->columnMoved(); break;
        case 16: _t->reexpand(); break;
        case 17: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 18: _t->verticalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTreeView::*)(const QModelIndex & )>(_a, &QTreeView::expanded, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeView::*)(const QModelIndex & )>(_a, &QTreeView::collapsed, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->autoExpandDelay(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->indentation(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->rootIsDecorated(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->uniformRowHeights(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->itemsExpandable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isAnimated(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->allColumnsShowFocus(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isHeaderHidden(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->expandsOnDoubleClick(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoExpandDelay(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setIndentation(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setRootIsDecorated(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setUniformRowHeights(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setItemsExpandable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setAnimated(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setAllColumnsShowFocus(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setHeaderHidden(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setExpandsOnDoubleClick(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->resetIndentation(); break;
        default: break;
        }
    }
}